

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

int SPRKStepReInit(void *arkode_mem,ARKRhsFn f1,ARKRhsFn f2,sunrealtype t0,N_Vector y0)

{
  ARKodeSPRKStepMem pAVar1;
  ARKodeMem ark_mem_00;
  int iVar2;
  int line;
  int error_code;
  char *msgfmt;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeSPRKStepMem local_40;
  ARKodeMem local_38;
  
  local_38 = (ARKodeMem)0x0;
  local_40 = (ARKodeSPRKStepMem)0x0;
  iVar2 = sprkStep_AccessARKODEStepMem(arkode_mem,"SPRKStepReInit",&local_38,&local_40);
  ark_mem_00 = local_38;
  pAVar1 = local_40;
  if (iVar2 == 0) {
    if (local_38->MallocDone == 0) {
      msgfmt = "Attempt to call before ARKodeInit.";
      iVar2 = -0x17;
      error_code = -0x17;
      line = 0xc3;
    }
    else if (f1 == (ARKRhsFn)0x0 || f2 == (ARKRhsFn)0x0) {
      msgfmt = "Must specify at least one of fe, fi (both NULL).";
      iVar2 = -0x16;
      error_code = -0x16;
      line = 0xcb;
    }
    else {
      if (y0 != (N_Vector)0x0) {
        local_40->f1 = f1;
        local_40->f2 = f2;
        iVar2 = arkInit(local_38,t0,y0,0);
        if (iVar2 != 0) {
          arkProcessError(ark_mem_00,iVar2,0xe0,"SPRKStepReInit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                          ,"Unable to reinitialize main ARKODE infrastructure");
          return iVar2;
        }
        pAVar1->nf1 = 0;
        pAVar1->nf2 = 0;
        pAVar1->istage = 0;
        N_VConst(0,pAVar1->yerr);
        return 0;
      }
      msgfmt = "y0 = NULL illegal.";
      iVar2 = -0x16;
      error_code = -0x16;
      line = 0xd3;
    }
    arkProcessError(local_38,error_code,line,"SPRKStepReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,msgfmt);
  }
  return iVar2;
}

Assistant:

int SPRKStepReInit(void* arkode_mem, ARKRhsFn f1, ARKRhsFn f2, sunrealtype t0,
                   N_Vector y0)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check that f1 and f2 are supplied */
  if (!f1 || !f2)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (!y0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->f1 = f1;
  step_mem->f2 = f2;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to reinitialize main ARKODE infrastructure");
    return (retval);
  }

  /* Initialize the counters */
  step_mem->nf1    = 0;
  step_mem->nf2    = 0;
  step_mem->istage = 0;

  /* Zero yerr for compensated summation */
  N_VConst(ZERO, step_mem->yerr);

  return (ARK_SUCCESS);
}